

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_decoder.hpp
# Opt level: O0

int andyzip::brotli_decoder::log2_floor(int x)

{
  undefined4 local_10;
  undefined4 local_c;
  int result;
  int x_local;
  
  local_10 = 0;
  for (local_c = x; local_c != 0; local_c = local_c >> 1) {
    local_10 = local_10 + 1;
  }
  return local_10;
}

Assistant:

static int log2_floor(int x) {
      int result = 0;
      while (x) {
        x >>= 1;
        ++result;
      }
      return result;
    }